

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O0

long __thiscall
text_subtitles::TextToPGSConverter::composeObjectDefinition
          (TextToPGSConverter *this,uint8_t *buff,int64_t pts,int64_t dts,int firstLine,int lastLine
          ,bool needPgHeader)

{
  uint8_t *puVar1;
  bool bVar2;
  long lVar3;
  uint8_t *puVar4;
  reference ppuVar5;
  size_type sVar6;
  uint8_t *puVar7;
  int local_a4;
  int local_8c;
  int size;
  int MAX_PG_PACKET;
  uint8_t *fragmentStart;
  uint8_t *local_70;
  uint8_t *sizePos;
  uint8_t *curPos;
  int blocks;
  int srcProcessed;
  uint8_t *srcData;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> seqPos;
  bool needPgHeader_local;
  int lastLine_local;
  int firstLine_local;
  int64_t dts_local;
  int64_t pts_local;
  uint8_t *buff_local;
  TextToPGSConverter *this_local;
  
  seqPos.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = needPgHeader;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&srcData);
  _blocks = this->m_renderedData;
  curPos._4_4_ = 0;
  curPos._0_4_ = 0;
  local_70 = buff;
  sizePos = buff;
  do {
    if ((seqPos.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      lVar3 = writePGHeader(sizePos,pts,dts);
      sizePos = sizePos + lVar3;
    }
    puVar1 = sizePos;
    *sizePos = '\x15';
    puVar4 = sizePos + 3;
    *puVar4 = '\0';
    puVar7 = sizePos + 5;
    sizePos[4] = '\0';
    sizePos = sizePos + 6;
    *puVar7 = '\0';
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&srcData,&sizePos);
    puVar7 = sizePos + 1;
    *sizePos = '\0';
    if ((int)curPos == 0) {
      sizePos = sizePos + 4;
      AV_WB16(sizePos,this->m_videoWidth);
      sizePos = sizePos + 2;
      AV_WB16(sizePos,((short)lastLine - (short)firstLine) + 1);
      local_70 = puVar7;
      puVar7 = sizePos + 2;
    }
    sizePos = puVar7;
    local_8c = 0xffeb;
    if ((int)curPos == 0) {
      local_8c = 0xffe4;
    }
    if (local_8c < this->m_rleLen - curPos._4_4_) {
      local_a4 = local_8c;
    }
    else {
      local_a4 = this->m_rleLen - curPos._4_4_;
    }
    memcpy(sizePos,_blocks + curPos._4_4_,(long)local_a4);
    curPos._4_4_ = curPos._4_4_ + local_a4;
    sizePos = sizePos + local_a4;
    AV_WB16(puVar1 + 1,(short)sizePos - (short)puVar4);
    curPos._0_4_ = (int)curPos + 1;
  } while (curPos._4_4_ < this->m_rleLen);
  AV_WB24(local_70,this->m_rleLen + 4);
  bVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::empty
                    ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&srcData);
  if (!bVar2) {
    ppuVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&srcData,0);
    **ppuVar5 = **ppuVar5 | 0x80;
    sVar6 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                      ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&srcData);
    ppuVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&srcData,
                         sVar6 - 1);
    **ppuVar5 = **ppuVar5 | 0x40;
  }
  lVar3 = (long)sizePos - (long)buff;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&srcData);
  return lVar3;
}

Assistant:

long TextToPGSConverter::composeObjectDefinition(uint8_t* buff, const int64_t pts, const int64_t dts,
                                                 const int firstLine, const int lastLine, const bool needPgHeader) const
{
    std::vector<uint8_t*> seqPos;

    const uint8_t* srcData = m_renderedData;
    int srcProcessed = 0;
    int blocks = 0;
    uint8_t* curPos = buff;
    uint8_t* sizePos = buff;
    do
    {
        if (needPgHeader)
            curPos += writePGHeader(curPos, pts, dts);
        *curPos++ = OBJECT_DEF_SEGMENT;
        curPos += 2;  // skip length field
        uint8_t* fragmentStart = curPos;
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // object version number
        seqPos.push_back(curPos);
        *curPos++ = 0;  // 0xc0; // sequence descriptor: first=true, last=true

        if (blocks == 0)
        {
            sizePos = curPos;
            // object data header
            curPos += 3;  // skip total size
            AV_WB16(curPos, m_videoWidth);
            curPos += 2;
            AV_WB16(curPos, static_cast<uint16_t>(lastLine - firstLine + 1));
            curPos += 2;
        }

        int MAX_PG_PACKET = 65515;
        if (blocks == 0)
            MAX_PG_PACKET -= 7;
        const int size = FFMIN(m_rleLen - srcProcessed, MAX_PG_PACKET);
        memcpy(curPos, srcData + srcProcessed, size);
        srcProcessed += size;
        curPos += size;

        AV_WB16(fragmentStart - 2, static_cast<uint16_t>(curPos - fragmentStart));  // correct length field
        blocks++;
    } while (srcProcessed < m_rleLen);
    AV_WB24(sizePos, m_rleLen + 4);  // object len
    if (!seqPos.empty())
    {
        *(seqPos[0]) |= 0x80;
        *(seqPos[seqPos.size() - 1]) |= 0x40;
    }
    return static_cast<long>(curPos - buff);
}